

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O3

Var Js::JavascriptPromise::EntryAny(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  ThreadContext *this_00;
  void *pvVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptPromiseCapability *capabilities;
  RecyclableObject *instance;
  RecyclableObject *this_01;
  RecyclableObject *pRVar9;
  JavascriptArray *errors;
  Recycler *pRVar10;
  RecyclableObject *nextFunc;
  JavascriptMethod p_Var11;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper;
  JavascriptPromiseAnyRejectElementFunction *pJVar12;
  RecyclableObject *pRVar13;
  JavascriptError *pError;
  int32 hCode;
  int in_stack_00000010;
  undefined1 local_f0 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  undefined1 local_a0 [8];
  TrackAllocData data;
  CallInfo local_70;
  CallInfo callInfo_local;
  uint32 local_44;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_70 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x112,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00ced3f7;
    *puVar7 = 0;
  }
  __tag.entry.next = (Entry *)callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&__tag.entry.next,&local_70);
  if ((local_70._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x113,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) {
LAB_00ced3f7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_f0,function,local_70,L"Promise.any",&stack0x00000000
            );
  pvVar8 = Arguments::operator[]((Arguments *)&__tag.entry.next,0);
  capabilities = NewPromiseCapability(pvVar8,pSVar1);
  instance = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  pvVar8 = JavascriptOperators::GetProperty(instance,0x134,pSVar1,(PropertyValueInfo *)0x0);
  bVar5 = JavascriptConversion::IsCallable(pvVar8);
  if (!bVar5) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec76,(PCWSTR)0x0);
  }
  this_01 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
  if (((ulong)__tag.entry.next & 0xfffffe) == 0) {
    pRVar9 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    pRVar9 = (RecyclableObject *)Arguments::operator[]((Arguments *)&__tag.entry.next,1);
  }
  pRVar9 = JavascriptOperators::GetIterator(pRVar9,pSVar1,false);
  errors = JavascriptLibrary::CreateArray(this);
  local_a0 = (undefined1  [8])
             &JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_7ba9e0c;
  data.filename._0_4_ = 0x142;
  pRVar10 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_a0);
  callInfo_local = (CallInfo)new<Memory::Recycler>(4,pRVar10,0x56b216);
  *(undefined4 *)callInfo_local = 1;
  data.line = 0;
  data._36_4_ = 0;
  nextFunc = JavascriptOperators::CacheIteratorNext(pRVar9,pSVar1);
  local_44 = 0;
  while( true ) {
    bVar5 = JavascriptOperators::IteratorStepAndValue(pRVar9,pSVar1,nextFunc,(Var *)&data.line);
    uVar4 = data._32_8_;
    if (!bVar5) {
      *(int *)callInfo_local = *(int *)callInfo_local + -1;
      if (*(int *)callInfo_local != 0) {
        pvVar2 = (capabilities->promise).ptr;
        AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_f0)
        ;
        return pvVar2;
      }
      pError = JavascriptLibrary::CreateAggregateError(this);
      JavascriptError::SetErrorsList(pError,errors,pSVar1);
      JavascriptError::SetErrorMessage(pError,-0x7ff5ea0a,L"",pSVar1);
      JavascriptExceptionOperators::Throw(pError,pSVar1);
    }
    pRVar13 = (this->super_JavascriptLibraryBase).undefinedValue.ptr;
    JavascriptArray::BigIndex::BigIndex((BigIndex *)local_a0,(errors->super_ArrayObject).length);
    JavascriptArray::BigIndex::SetItem((BigIndex *)local_a0,errors,pRVar13);
    this_00 = pSVar1->threadContext;
    bVar5 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint(this_01);
    CheckIsExecutable(this_01,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint(this_01);
    pvVar8 = (*p_Var11)(this_01,(CallInfo)this_01,0x2000002,0,0,0,0,0x2000002,instance,uVar4);
    this_00->reentrancySafeOrHandled = bVar5;
    local_a0 = (undefined1  [8])
               &JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_7ba9e0c;
    data.filename._0_4_ = 0x15c;
    pRVar10 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_a0);
    alreadyCalledWrapper =
         (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
         new<Memory::Recycler>(1,pRVar10,0x56b216);
    alreadyCalledWrapper->alreadyResolved = false;
    pJVar12 = JavascriptLibrary::CreatePromiseAnyRejectElementFunction
                        (this,EntryAnyRejectElementFunction,local_44,errors,capabilities,
                         (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
                         callInfo_local,alreadyCalledWrapper);
    *(int *)callInfo_local = *(int *)callInfo_local + 1;
    BVar6 = JavascriptConversion::ToObject(pvVar8,pSVar1,(RecyclableObject **)local_a0);
    if (BVar6 == 0) break;
    pvVar8 = JavascriptOperators::GetProperty
                       ((RecyclableObject *)local_a0,0x169,pSVar1,(PropertyValueInfo *)0x0);
    bVar5 = JavascriptConversion::IsCallable(pvVar8);
    if (!bVar5) {
      hCode = -0x7ff5ec76;
      goto LAB_00ced3e1;
    }
    pRVar13 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    bVar5 = this_00->reentrancySafeOrHandled;
    this_00->reentrancySafeOrHandled = true;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar1->threadContext);
    if (pSVar1->threadContext->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar13);
    CheckIsExecutable(pRVar13,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint(pRVar13);
    (*p_Var11)(pRVar13,(CallInfo)pRVar13,0x2000003,0,0,0,0,0x2000003,local_a0,
               (capabilities->resolve).ptr,pJVar12);
    this_00->reentrancySafeOrHandled = bVar5;
    local_44 = local_44 + 1;
  }
  hCode = -0x7ff5ec71;
LAB_00ced3e1:
  JavascriptError::ThrowTypeError(pSVar1,hCode,(PCWSTR)0x0);
}

Assistant:

Var JavascriptPromise::EntryAny(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.any"));

        // 1. Let C be the this value.
        Var C = args[0];

        // 2. Let promiseCapability be ? NewPromiseCapability(C).
        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(C, scriptContext);
        RecyclableObject* constructor = UnsafeVarTo<RecyclableObject>(C);

        JavascriptLibrary* library = scriptContext->GetLibrary();
        RecyclableObject* promiseResolve = nullptr;
        RecyclableObject* iteratorRecord = nullptr;
        try {
            // 3. Let promiseResolve be GetPromiseResolve(C).
            // 4. IfAbruptRejectPromise(promiseResolve, promiseCapability).
            Var resolveVar = JavascriptOperators::GetProperty(constructor, Js::PropertyIds::resolve, scriptContext);
            if (!JavascriptConversion::IsCallable(resolveVar))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
            }
            promiseResolve = UnsafeVarTo<RecyclableObject>(resolveVar);

            // 5. Let iteratorRecord be GetIterator(iterable).
            // 6. IfAbruptRejectPromise(iteratorRecord, promiseCapability).
            Var iterable = args.Info.Count > 1 ? args[1] : library->GetUndefined();
            iteratorRecord = JavascriptOperators::GetIterator(iterable, scriptContext); 
        }
        catch (const JavascriptException& err)
        {
            JavascriptExceptionObject* exception = err.GetAndClear();
            return JavascriptPromise::CreateRejectedPromise(exception->GetThrownObject(scriptContext), scriptContext);
        }

        // Abstract operation PerformPromiseAny
        // 7. Let result be PerformPromiseAny(iteratorRecord, C, promiseCapability, promiseResolve).
        try {
            // 1. Assert: ! IsConstructor(constructor) is true. 
            // 2. Assert: resultCapability is a PromiseCapability Record.
            // 3. Assert: ! IsCallable(promiseResolve) is true.
            // 4. Let errors be a new empty List.
            JavascriptArray* errors = library->CreateArray();

            // 5. Let remainingElementsCount be a new Record { [[Value]]: 1 }.
            JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper);
            remainingElementsWrapper->remainingElements = 1;

            // 6. Let index be 0.
            uint32 index = 0;

            // 7. Repeat,
            JavascriptOperators::DoIteratorStepAndValue(iteratorRecord, scriptContext, [&](Var nextValue) {
                // a. Let next be IteratorStep(iteratorRecord).
                // e. Let nextValue be IteratorValue(next).
                // h. Append undefined to errors.
                errors->DirectAppendItem(library->GetUndefined());

                // i. Let nextPromise be ? Call(promiseResolve, constructor, << nextValue >> ).
                ThreadContext* threadContext = scriptContext->GetThreadContext();
                Var nextPromise = nullptr;
                BEGIN_SAFE_REENTRANT_CALL(threadContext);
                {
                    nextPromise = CALL_FUNCTION(threadContext,
                        promiseResolve, Js::CallInfo(CallFlags_Value, 2),
                        constructor,
                        nextValue);
                }
                END_SAFE_REENTRANT_CALL;


                JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
                alreadyCalledWrapper->alreadyResolved = false;

                // j. Let steps be the algorithm steps defined in Promise.any Reject Element Functions.
                // k. Let rejectElement be ! CreateBuiltinFunction(steps, << [[AlreadyCalled]], [[Index]], [[Errors]], [[Capability]], [[RemainingElements]] >> ).
                // p. Set rejectElement.[[RemainingElements]] to remainingElementsCount.
                Var rejectElement = library->CreatePromiseAnyRejectElementFunction(EntryAnyRejectElementFunction, index, errors, promiseCapability, remainingElementsWrapper, alreadyCalledWrapper);

                // q. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] + 1.
                remainingElementsWrapper->remainingElements++;

                // r. Perform ? Invoke(nextPromise, "then", << resultCapability.[[Resolve]], rejectElement >> ).
                RecyclableObject* nextPromiseObject;
                if (!JavascriptConversion::ToObject(nextPromise, scriptContext, &nextPromiseObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
                }
                Var thenVar = JavascriptOperators::GetProperty(nextPromiseObject, Js::PropertyIds::then, scriptContext);
                if (!JavascriptConversion::IsCallable(thenVar))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
                }

                RecyclableObject* thenFunc = UnsafeVarTo<RecyclableObject>(thenVar);

                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    CALL_FUNCTION(scriptContext->GetThreadContext(),
                        thenFunc, Js::CallInfo(CallFlags_Value, 3),
                        nextPromiseObject,
                        promiseCapability->GetResolve(),
                        rejectElement);
                }
                END_SAFE_REENTRANT_CALL;

                // s.Increase index by 1.
                index++;
            });

            // 7.d. If next is false, then
            // 7.d.i. Set iteratorRecord.[[Done]] to true.
            // 7.d.ii. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] - 1.
            remainingElementsWrapper->remainingElements--;
            // 7.d.iii. If remainingElementsCount.[[Value]] is 0, then
            if (remainingElementsWrapper->remainingElements == 0)
            {
                // 7.d.iii.1 Let error be a newly created AggregateError object.
                JavascriptError* pError = library->CreateAggregateError();
                JavascriptError::SetErrorsList(pError, errors, scriptContext);
                JavascriptError::SetErrorMessage(pError, JSERR_PromiseAllRejected, _u(""), scriptContext);
                JavascriptExceptionOperators::Throw(pError, scriptContext);
            }
        }
        catch (const JavascriptException& err)
        {
            // 8. If result is an abrupt completion, then
            //   a. If iteratorRecord.[[Done]] is false, set result to IteratorClose(iteratorRecord, result).
            //   b. IfAbruptRejectPromise(result, promiseCapability).
            JavascriptExceptionObject* exception = err.GetAndClear();
            TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        return promiseCapability->GetPromise();
    }